

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parsePoint(Parser *this,QString *data,qsizetype offset)

{
  QChar ch;
  QChar ch_00;
  QChar ch_01;
  QChar ch_02;
  QChar ch_03;
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  parameter_type in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  int endOfParams;
  bool params;
  qsizetype endOfPoint2;
  qsizetype endOfPoint;
  qsizetype endOfProvider;
  qsizetype beginOfProvider;
  QString provider;
  Point point;
  parameter_type in_stack_fffffffffffffea8;
  parameter_type in_stack_fffffffffffffeb0;
  QString *in_stack_fffffffffffffeb8;
  parameter_type this_00;
  parameter_type n;
  undefined4 in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  byte bVar4;
  QLatin1Char local_ab [52];
  QLatin1Char local_77 [4];
  QLatin1Char local_73 [27];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  QLatin1Char local_f [4];
  QLatin1Char local_b [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLatin1Char::QLatin1Char(local_b,'(');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)in_stack_fffffffffffffeb0,
             (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
  ch.ucs._1_1_ = in_stack_fffffffffffffedf;
  ch.ucs._0_1_ = in_stack_fffffffffffffede;
  QString::indexOf(in_stack_fffffffffffffeb8,ch,(qsizetype)in_stack_fffffffffffffeb0,
                   (CaseSensitivity)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  n = in_RSI;
  QLatin1Char::QLatin1Char(local_f,',');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)in_stack_fffffffffffffeb0,
             (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
  ch_00.ucs._1_1_ = in_stack_fffffffffffffedf;
  ch_00.ucs._0_1_ = in_stack_fffffffffffffede;
  QString::indexOf(in_stack_fffffffffffffeb8,ch_00,(qsizetype)in_stack_fffffffffffffeb0,
                   (CaseSensitivity)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  memset(&local_40,0,0x30);
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  Point::Point(in_stack_fffffffffffffeb0);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  QString::mid((QString *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,
                                 CONCAT24(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))),
               in_RDI,(qsizetype)n);
  QString::simplified(&in_stack_fffffffffffffea8->name);
  QString::~QString((QString *)0x10abae);
  bVar1 = ::operator!=(&in_stack_fffffffffffffeb0->name,&in_stack_fffffffffffffea8->name);
  if (!bVar1) {
    in_stack_fffffffffffffeb0 = in_RSI;
    QLatin1Char::QLatin1Char(local_73,',');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffeb0,
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
    ch_01.ucs._1_1_ = in_stack_fffffffffffffedf;
    ch_01.ucs._0_1_ = in_stack_fffffffffffffede;
    qVar2 = QString::indexOf(in_stack_fffffffffffffeb8,ch_01,(qsizetype)in_stack_fffffffffffffeb0,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    this_00 = in_RSI;
    QLatin1Char::QLatin1Char(local_77,')');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffeb0,(QLatin1Char)(char)((ulong)this_00 >> 0x38));
    ch_02.ucs._1_1_ = in_stack_fffffffffffffedf;
    ch_02.ucs._0_1_ = in_stack_fffffffffffffede;
    qVar3 = QString::indexOf(&this_00->name,ch_02,(qsizetype)in_stack_fffffffffffffeb0,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    bVar4 = 1;
    if ((qVar2 == -1) || (qVar3 < qVar2)) {
      bVar4 = 0;
    }
    QString::mid((QString *)
                 CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffede,
                                         CONCAT24(in_stack_fffffffffffffedc,
                                                  in_stack_fffffffffffffed8))),in_RDI,(qsizetype)n);
    QString::simplified(&in_stack_fffffffffffffea8->name);
    QString::operator=(&in_stack_fffffffffffffeb0->name,&in_stack_fffffffffffffea8->name);
    QString::~QString((QString *)0x10ad0e);
    QString::~QString((QString *)0x10ad1b);
    if ((bVar4 & 1) != 0) {
      QLatin1Char::QLatin1Char(local_ab,')');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)in_stack_fffffffffffffeb0,(QLatin1Char)(char)((ulong)this_00 >> 0x38));
      ch_03.ucs._1_1_ = bVar4;
      ch_03.ucs._0_1_ = in_stack_fffffffffffffede;
      qVar2 = QString::indexOf(&this_00->name,ch_03,(qsizetype)in_stack_fffffffffffffeb0,
                               (CaseSensitivity)((ulong)in_RSI >> 0x20));
      QString::mid((QString *)
                   CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffede,
                                           CONCAT24(in_stack_fffffffffffffedc,(int)qVar2))),in_RDI,
                   (qsizetype)n);
      QString::simplified(&in_RSI->name);
      QString::operator=(&in_stack_fffffffffffffeb0->name,&in_RSI->name);
      QString::~QString((QString *)0x10add3);
      QString::~QString((QString *)0x10addd);
      in_stack_fffffffffffffea8 = in_RSI;
    }
    QList<Point>::push_back((QList<Point> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  QString::~QString((QString *)0x10ae08);
  Point::~Point(in_stack_fffffffffffffeb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Parser::parsePoint(const QString &data, qsizetype offset)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(','), beginOfProvider);
    Point point;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype endOfPoint = data.indexOf(QLatin1Char(','), endOfProvider + 1);
    qsizetype endOfPoint2 = data.indexOf(QLatin1Char(')'), endOfProvider + 1);
    bool params = true;
    if (endOfPoint == -1 || endOfPoint2 < endOfPoint) {
        endOfPoint = endOfPoint2;
        params = false;
    }
    point.name = data.mid(endOfProvider + 1, endOfPoint - endOfProvider - 1).simplified();
    if (params) {
        int endOfParams = data.indexOf(QLatin1Char(')'), endOfPoint);
        point.parameters = data.mid(endOfPoint + 1, endOfParams - endOfPoint - 1).simplified();
    }

    DEBUGPRINTF(printf("tracepointgen: %s(%s)\n", qPrintable(point.name), qPrintable(point.parameters)));

    m_points.push_back(point);
}